

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::DeepScanLineInputFile::~DeepScanLineInputFile(DeepScanLineInputFile *this)

{
  char *pcVar1;
  _func_int **pp_Var2;
  size_type sVar3;
  reference ppLVar4;
  GenericInputFile *in_RDI;
  Data *unaff_retaddr;
  size_t i;
  ulong local_10;
  
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__DeepScanLineInputFile_00562988;
  if ((((ulong)in_RDI[1]._vptr_GenericInputFile[0x40] & 1) != 0) &&
     (*(long **)(in_RDI[1]._vptr_GenericInputFile[0x3f] + 0x28) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI[1]._vptr_GenericInputFile[0x3f] + 0x28) + 8))();
  }
  if (in_RDI[1]._vptr_GenericInputFile != (_func_int **)0x0) {
    if (((ulong)in_RDI[1]._vptr_GenericInputFile[0x30] & 1) == 0) {
      for (local_10 = 0;
          sVar3 = std::
                  vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                  ::size((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                          *)(in_RDI[1]._vptr_GenericInputFile + 0x2a)), local_10 < sVar3;
          local_10 = local_10 + 1) {
        ppLVar4 = std::
                  vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                  ::operator[]((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                *)(in_RDI[1]._vptr_GenericInputFile + 0x2a),local_10);
        pcVar1 = ((*ppLVar4)->buffer)._data;
        if (pcVar1 != (char *)0x0) {
          operator_delete__(pcVar1);
        }
      }
    }
    if (((*(int *)((long)in_RDI[1]._vptr_GenericInputFile + 0x16c) == -1) &&
        (in_RDI[1]._vptr_GenericInputFile[0x3f] != (_func_int *)0x0)) &&
       (in_RDI[1]._vptr_GenericInputFile[0x3f] != (_func_int *)0x0)) {
      operator_delete(in_RDI[1]._vptr_GenericInputFile[0x3f],0x38);
    }
    pp_Var2 = in_RDI[1]._vptr_GenericInputFile;
    if (pp_Var2 != (_func_int **)0x0) {
      Data::~Data(unaff_retaddr);
      operator_delete(pp_Var2,0x208);
    }
  }
  GenericInputFile::~GenericInputFile(in_RDI);
  return;
}

Assistant:

DeepScanLineInputFile::~DeepScanLineInputFile ()
{
    if (_data->_deleteStream)
        delete _data->_streamData->is;

    if (_data)
    {
        if (!_data->memoryMapped)
            for (size_t i = 0; i < _data->lineBuffers.size(); i++)
                delete [] _data->lineBuffers[i]->buffer;

        //
        // Unless this file was opened via the multipart API, delete the streamdata
        // object too.
        // (TODO) it should be "isMultiPart(data->version)", but when there is only
        // single part,
        // (see the above constructor) the version field is not set.
        //
        // (TODO) we should have a way to tell if the stream data is owned by this
        // file or by a parent multipart file.
        //

        if (_data->partNumber == -1 && _data->_streamData)
        {
            delete _data->_streamData;
        }
        delete _data;
    }
}